

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O3

int CTcSymPropBase::load_from_obj_file(CVmFile *fp,textchar_t *fname,tctarg_prop_id_t *prop_xlat)

{
  byte *pbVar1;
  short sVar2;
  undefined8 in_RAX;
  char *__s;
  size_t len;
  CVmHashEntry *this;
  char *siz;
  char b [4];
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  __s = CTcSymbolBase::base_read_from_sym_file(fp);
  if (__s == (char *)0x0) {
    return 1;
  }
  len = strlen(__s);
  CVmFile::read_bytes(fp,(char *)&local_34,4);
  siz = __s;
  this = (CVmHashEntry *)CTcPrsSymtab::find(G_prs->global_symtab_,__s,len,(CTcPrsSymtab **)0x0);
  if (this == (CVmHashEntry *)0x0) {
    this = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)siz);
    sVar2 = (short)*(undefined4 *)&G_cg->next_prop_;
    G_cg->next_prop_ = sVar2 + 1;
    CVmHashEntry::CVmHashEntry(this,__s,len,0);
    *(undefined4 *)&this->field_0x24 = 3;
    *(short *)&this[1]._vptr_CVmHashEntry = sVar2;
    pbVar1 = (byte *)((long)&this[1]._vptr_CVmHashEntry + 2);
    *pbVar1 = *pbVar1 & 0xf8;
    this->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00318a40;
    (*G_prs->global_symtab_->_vptr_CTcPrsSymtab[3])(G_prs->global_symtab_,this);
  }
  else if (*(int *)&this->field_0x24 != 3) {
    CTcSymbolBase::log_objfile_conflict((CTcSymbolBase *)this,fname,TC_SYM_PROP);
    return 0;
  }
  prop_xlat[local_34] =
       *(tctarg_prop_id_t *)
        &(((CTcSymbolBase *)&this[1]._vptr_CVmHashEntry)->super_CVmHashEntryCS).super_CVmHashEntry.
         _vptr_CVmHashEntry;
  return 0;
}

Assistant:

int CTcSymPropBase::load_from_obj_file(class CVmFile *fp,
                                       const textchar_t *fname,
                                       tctarg_prop_id_t *prop_xlat)
{
    /* read the symbol name information */
    const char *txt;
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 1;
    size_t len = strlen(txt);

    /* read our property ID */
    ulong id = fp->read_uint4();

    /* 
     *   If this symbol is already defined, make sure the original
     *   definition is a property.  If it's not defined, define it anew.  
     */
    CTcSymProp *sym = (CTcSymProp *)G_prs->get_global_symtab()->find(txt, len);
    if (sym == 0)
    {
        /* 
         *   It's not defined yet - create the new definition and add it
         *   to the symbol table.  Allocate a new property ID for the
         *   symbol in the normal fashion.  
         */
        sym = new CTcSymProp(txt, len, FALSE, G_cg->new_prop_id());
        G_prs->get_global_symtab()->add_entry(sym);
    }
    else if (sym->get_type() != TC_SYM_PROP)
    {
        /* 
         *   It's not already defined as a property - log a symbol type
         *   conflict error 
         */
        sym->log_objfile_conflict(fname, TC_SYM_PROP);

        /* 
         *   proceed despite the error, since this is merely a symbol
         *   conflict and not a file corruption 
         */
        return 0;
    }

    /*
     *   Set the translation table entry for the symbol.  We know the
     *   original ID local to the object file, and we know the new global
     *   property ID.
     */
    prop_xlat[id] = sym->get_prop();

    /* success */
    return 0;
}